

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O3

CURLcode cf_ssl_find_peer_by_key
                   (Curl_easy *data,Curl_ssl_scache *scache,char *ssl_peer_key,
                   ssl_primary_config *conn_config,Curl_ssl_scache_peer **ppeer)

{
  uchar *puVar1;
  uchar *puVar2;
  curl_trc_feat *pcVar3;
  Curl_ssl_scache_peer *pCVar4;
  _Bool _Var5;
  int iVar6;
  CURLcode CVar7;
  size_t buflen;
  char *pcVar8;
  CURLcode CVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uchar my_hmac [32];
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  *ppeer = (Curl_ssl_scache_peer *)0x0;
  CVar7 = CURLE_BAD_FUNCTION_ARGUMENT;
  if (scache->magic == 0xe1551) {
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
       && (0 < Curl_trc_feat_ssls.log_level)) {
      Curl_trc_ssls(data,"find peer slot for %s among %zu slots",ssl_peer_key,scache->peer_count);
    }
    if (scache->peer_count != 0) {
      lVar10 = 0;
      uVar11 = 0;
      do {
        pcVar8 = *(char **)(scache->peers->key_salt + lVar10 + -0x50);
        if (((pcVar8 != (char *)0x0) && (iVar6 = curl_strequal(ssl_peer_key,pcVar8), iVar6 != 0)) &&
           (_Var5 = cf_ssl_scache_match_auth
                              ((Curl_ssl_scache_peer *)(scache->peers->key_salt + lVar10 + -0x50),
                               conn_config), _Var5)) {
          *ppeer = (Curl_ssl_scache_peer *)(scache->peers->key_salt + lVar10 + -0x50);
          return CURLE_OK;
        }
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0xa8;
      } while (uVar11 < scache->peer_count);
      if (scache->peer_count != 0) {
        lVar10 = 0;
        buflen = 0;
        uVar11 = 0;
        do {
          pCVar4 = scache->peers;
          if (((*(long *)(pCVar4->key_salt + lVar10 + -0x50) == 0) &&
              ((pCVar4->key_hmac[lVar10 + 0x30] & 1) != 0)) &&
             (_Var5 = cf_ssl_scache_match_auth
                                ((Curl_ssl_scache_peer *)(pCVar4->key_salt + lVar10 + -0x50),
                                 conn_config), _Var5)) {
            if (buflen == 0) {
              buflen = strlen(ssl_peer_key);
            }
            CVar7 = Curl_hmacit(&Curl_HMAC_SHA256,scache->peers->key_salt + lVar10,0x20,
                                (uchar *)ssl_peer_key,buflen,&local_58);
            if (CVar7 != CURLE_OK) {
              return CVar7;
            }
            puVar1 = scache->peers->key_hmac + lVar10;
            puVar2 = scache->peers->key_hmac + lVar10 + 0x10;
            auVar13[0] = -(*puVar2 == local_48);
            auVar13[1] = -(puVar2[1] == uStack_47);
            auVar13[2] = -(puVar2[2] == uStack_46);
            auVar13[3] = -(puVar2[3] == uStack_45);
            auVar13[4] = -(puVar2[4] == uStack_44);
            auVar13[5] = -(puVar2[5] == uStack_43);
            auVar13[6] = -(puVar2[6] == uStack_42);
            auVar13[7] = -(puVar2[7] == uStack_41);
            auVar13[8] = -(puVar2[8] == uStack_40);
            auVar13[9] = -(puVar2[9] == uStack_3f);
            auVar13[10] = -(puVar2[10] == uStack_3e);
            auVar13[0xb] = -(puVar2[0xb] == uStack_3d);
            auVar13[0xc] = -(puVar2[0xc] == uStack_3c);
            auVar13[0xd] = -(puVar2[0xd] == uStack_3b);
            auVar13[0xe] = -(puVar2[0xe] == uStack_3a);
            auVar13[0xf] = -(puVar2[0xf] == uStack_39);
            auVar12[0] = -(*puVar1 == local_58);
            auVar12[1] = -(puVar1[1] == uStack_57);
            auVar12[2] = -(puVar1[2] == uStack_56);
            auVar12[3] = -(puVar1[3] == uStack_55);
            auVar12[4] = -(puVar1[4] == uStack_54);
            auVar12[5] = -(puVar1[5] == uStack_53);
            auVar12[6] = -(puVar1[6] == uStack_52);
            auVar12[7] = -(puVar1[7] == uStack_51);
            auVar12[8] = -(puVar1[8] == uStack_50);
            auVar12[9] = -(puVar1[9] == uStack_4f);
            auVar12[10] = -(puVar1[10] == uStack_4e);
            auVar12[0xb] = -(puVar1[0xb] == uStack_4d);
            auVar12[0xc] = -(puVar1[0xc] == uStack_4c);
            auVar12[0xd] = -(puVar1[0xd] == uStack_4b);
            auVar12[0xe] = -(puVar1[0xe] == uStack_4a);
            auVar12[0xf] = -(puVar1[0xf] == uStack_49);
            auVar12 = auVar12 & auVar13;
            if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
              if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                  ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                   (0 < pcVar3->log_level)))) && (0 < Curl_trc_feat_ssls.log_level)) {
                Curl_trc_ssls(data,"peer entry %zu key recovered: %s",uVar11,ssl_peer_key);
              }
              pcVar8 = (*Curl_cstrdup)(ssl_peer_key);
              pCVar4 = scache->peers;
              *(char **)(pCVar4->key_salt + lVar10 + -0x50) = pcVar8;
              if (pcVar8 != (char *)0x0) {
                cf_ssl_cache_peer_update
                          ((Curl_ssl_scache_peer *)(pCVar4->key_salt + lVar10 + -0x50));
                *ppeer = (Curl_ssl_scache_peer *)(scache->peers->key_salt + lVar10 + -0x50);
                return CURLE_OK;
              }
              return CURLE_OUT_OF_MEMORY;
            }
          }
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0xa8;
        } while (uVar11 < scache->peer_count);
      }
    }
    CVar9 = CURLE_OK;
    CVar7 = CURLE_OK;
    if (((data != (Curl_easy *)0x0) && (CVar7 = CVar9, ((data->set).field_0x89f & 0x40) != 0)) &&
       (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)) &&
        (0 < Curl_trc_feat_ssls.log_level)))) {
      CVar7 = CURLE_OK;
      Curl_trc_ssls(data,"peer not found for %s",ssl_peer_key);
    }
  }
  return CVar7;
}

Assistant:

static CURLcode
cf_ssl_find_peer_by_key(struct Curl_easy *data,
                        struct Curl_ssl_scache *scache,
                        const char *ssl_peer_key,
                        struct ssl_primary_config *conn_config,
                        struct Curl_ssl_scache_peer **ppeer)
{
  size_t i, peer_key_len = 0;
  CURLcode result = CURLE_OK;

  *ppeer = NULL;
  if(!GOOD_SCACHE(scache)) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  CURL_TRC_SSLS(data, "find peer slot for %s among %zu slots",
                ssl_peer_key, scache->peer_count);

  /* check for entries with known peer_key */
  for(i = 0; scache && i < scache->peer_count; i++) {
    if(scache->peers[i].ssl_peer_key &&
       strcasecompare(ssl_peer_key, scache->peers[i].ssl_peer_key) &&
       cf_ssl_scache_match_auth(&scache->peers[i], conn_config)) {
      /* yes, we have a cached session for this! */
      *ppeer = &scache->peers[i];
      goto out;
    }
  }
  /* check for entries with HMAC set but no known peer_key */
  for(i = 0; scache && i < scache->peer_count; i++) {
    if(!scache->peers[i].ssl_peer_key &&
       scache->peers[i].hmac_set &&
       cf_ssl_scache_match_auth(&scache->peers[i], conn_config)) {
      /* possible entry with unknown peer_key, check hmac */
      unsigned char my_hmac[CURL_SHA256_DIGEST_LENGTH];
      if(!peer_key_len) /* we are lazy */
        peer_key_len = strlen(ssl_peer_key);
      result = Curl_hmacit(&Curl_HMAC_SHA256,
                           scache->peers[i].key_salt,
                           sizeof(scache->peers[i].key_salt),
                           (const unsigned char *)ssl_peer_key,
                           peer_key_len,
                           my_hmac);
      if(result)
        goto out;
      if(!memcmp(scache->peers[i].key_hmac, my_hmac, sizeof(my_hmac))) {
        /* remember peer_key for future lookups */
        CURL_TRC_SSLS(data, "peer entry %zu key recovered: %s",
                      i, ssl_peer_key);
        scache->peers[i].ssl_peer_key = strdup(ssl_peer_key);
        if(!scache->peers[i].ssl_peer_key) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        cf_ssl_cache_peer_update(&scache->peers[i]);
        *ppeer = &scache->peers[i];
        goto out;
      }
    }
  }
  CURL_TRC_SSLS(data, "peer not found for %s", ssl_peer_key);
out:
  return result;
}